

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int anon_unknown.dwarf_89e81::parse_upscale_multiplier(ParseResult *parse_result)

{
  int iVar1;
  OptionValue *this;
  int *piVar2;
  allocator<char> local_39;
  string local_38;
  int local_14;
  ParseResult *pPStack_10;
  int mult;
  ParseResult *parse_result_local;
  
  pPStack_10 = parse_result;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"upscale-mult",&local_39);
  this = cxxopts::ParseResult::operator[](parse_result,&local_38);
  piVar2 = cxxopts::OptionValue::as<int>(this);
  iVar1 = *piVar2;
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_14 = iVar1;
  SDL_LogDebug(0,"Upscale multiplier: %d",iVar1);
  return local_14;
}

Assistant:

[[nodiscard]] auto parse_upscale_multiplier(const cxxopts::ParseResult& parse_result)
	{
		auto mult = parse_result["upscale-mult"].as<int>();
		SDL_LogDebug(SDL_LOG_CATEGORY_APPLICATION, "Upscale multiplier: %d", mult);
		return mult;
	}